

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_properties.h
# Opt level: O3

bool __thiscall
BamTools::PropertyFilterValue::check<unsigned_int>(PropertyFilterValue *this,uint *query)

{
  uint uVar1;
  bool bVar2;
  Impl<unsigned_int> *pIVar3;
  long lVar4;
  char *pcVar5;
  
  bVar2 = Variant::is_type<unsigned_int>(&this->Value);
  if (bVar2) {
    bVar2 = Variant::is_type<std::__cxx11::string>(&this->Value);
    if (bVar2) {
      pcVar5 = "Cannot compare different types - query is a string!";
      lVar4 = 0x33;
      goto LAB_00161c73;
    }
    switch(this->Type) {
    case EXACT:
      uVar1 = *query;
      pIVar3 = Variant::CastFromBase<unsigned_int>((this->Value).data);
      bVar2 = uVar1 == pIVar3->data;
      break;
    case GREATER_THAN:
      uVar1 = *query;
      pIVar3 = Variant::CastFromBase<unsigned_int>((this->Value).data);
      bVar2 = pIVar3->data < uVar1;
      break;
    case GREATER_THAN_EQUAL:
      uVar1 = *query;
      pIVar3 = Variant::CastFromBase<unsigned_int>((this->Value).data);
      bVar2 = pIVar3->data <= uVar1;
      break;
    case LESS_THAN:
      uVar1 = *query;
      pIVar3 = Variant::CastFromBase<unsigned_int>((this->Value).data);
      bVar2 = uVar1 < pIVar3->data;
      break;
    case LESS_THAN_EQUAL:
      uVar1 = *query;
      pIVar3 = Variant::CastFromBase<unsigned_int>((this->Value).data);
      bVar2 = uVar1 <= pIVar3->data;
      break;
    case NOT:
      uVar1 = *query;
      pIVar3 = Variant::CastFromBase<unsigned_int>((this->Value).data);
      bVar2 = uVar1 != pIVar3->data;
      break;
    default:
      goto switchD_00161cc2_default;
    }
  }
  else {
    pcVar5 = "Cannot compare different types!";
    lVar4 = 0x1f;
LAB_00161c73:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
switchD_00161cc2_default:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool PropertyFilterValue::check(const T& query) const
{

    // ensure filter value & query are same type
    if (!Value.is_type<T>()) {
        std::cerr << "Cannot compare different types!" << std::endl;
        return false;
    }

    // string matching
    if (Value.is_type<std::string>()) {
        std::cerr << "Cannot compare different types - query is a string!" << std::endl;
        return false;
    }

    // numeric matching based on our filter type
    switch (Type) {
        case (PropertyFilterValue::EXACT):
            return (query == Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN):
            return (query > Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN_EQUAL):
            return (query >= Value.get<T>());
        case (PropertyFilterValue::LESS_THAN):
            return (query < Value.get<T>());
        case (PropertyFilterValue::LESS_THAN_EQUAL):
            return (query <= Value.get<T>());
        case (PropertyFilterValue::NOT):
            return (query != Value.get<T>());
        default:
            BAMTOOLS_ASSERT_UNREACHABLE;
    }
    return false;
}